

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd.c
# Opt level: O3

gdImagePtr gdImageCreateFromGdCtx(gdIOCtxPtr in)

{
  uint uVar1;
  int iVar2;
  gdImagePtr im;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int gd2xFlag;
  int sx;
  int sy;
  int pix;
  uint local_3c;
  int local_38;
  int local_34;
  
  iVar2 = gdGetWord((int *)&local_3c,in);
  uVar1 = local_3c;
  if (iVar2 == 0) {
    return (gdImagePtr)0x0;
  }
  if ((local_3c & 0xfffffffe) == 0xfffe) {
    iVar2 = gdGetWord((int *)&local_3c,in);
    if (iVar2 == 0) {
      return (gdImagePtr)0x0;
    }
    iVar2 = gdGetWord(&local_38,in);
    if (iVar2 == 0) {
      return (gdImagePtr)0x0;
    }
    gd2xFlag = 1;
    if (uVar1 == 0xfffe) {
      im = gdImageCreateTrueColor(local_3c,local_38);
      gd2xFlag = 1;
      goto LAB_001157ba;
    }
  }
  else {
    iVar2 = gdGetWord(&local_38,in);
    gd2xFlag = 0;
    if (iVar2 == 0) {
      return (gdImagePtr)0x0;
    }
  }
  im = gdImageCreate(local_3c,local_38);
LAB_001157ba:
  if (im != (gdImagePtr)0x0) {
    iVar2 = _gdGetColors(in,im,gd2xFlag);
    if (iVar2 != 0) {
      if (im->trueColor == 0) {
        if (local_38 < 1) {
          return im;
        }
        uVar3 = (ulong)local_3c;
        lVar4 = 0;
        iVar2 = local_38;
        do {
          if (0 < (int)uVar3) {
            lVar5 = 0;
            do {
              iVar2 = gdGetC(in);
              if (iVar2 == -1) goto LAB_0011588a;
              im->pixels[lVar4][lVar5] = (uchar)iVar2;
              lVar5 = lVar5 + 1;
              uVar3 = (ulong)(int)local_3c;
              iVar2 = local_38;
            } while (lVar5 < (long)uVar3);
          }
          lVar4 = lVar4 + 1;
          if (iVar2 <= lVar4) {
            return im;
          }
        } while( true );
      }
      if (local_38 < 1) {
        return im;
      }
      uVar3 = (ulong)local_3c;
      lVar4 = 0;
      iVar2 = local_38;
      do {
        if (0 < (int)uVar3) {
          lVar5 = 0;
          do {
            iVar2 = gdGetInt(&local_34,in);
            if (iVar2 == 0) goto LAB_0011588a;
            im->tpixels[lVar4][lVar5] = local_34;
            lVar5 = lVar5 + 1;
            uVar3 = (ulong)(int)local_3c;
            iVar2 = local_38;
          } while (lVar5 < (long)uVar3);
        }
        lVar4 = lVar4 + 1;
        if (iVar2 <= lVar4) {
          return im;
        }
      } while( true );
    }
LAB_0011588a:
    gdImageDestroy(im);
  }
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGdCtx (gdIOCtxPtr in)
{
	int sx, sy;
	int x, y;
	gdImagePtr im;

	/* Read the header */
	im = _gdCreateFromFile (in, &sx, &sy);

	if (im == NULL) {
		goto fail1;
	};

	/* Then the data... */
	/* 2.0.12: support truecolor properly in .gd as well as in .gd2.
	   Problem reported by Andreas Pfaller. */
	if (im->trueColor) {
		for (y = 0; (y < sy); y++) {
			for (x = 0; (x < sx); x++) {
				int pix;
				if (!gdGetInt (&pix, in)) {
					goto fail2;
				}
				im->tpixels[y][x] = pix;
			}
		}
	} else {
		for (y = 0; (y < sy); y++) {
			for (x = 0; (x < sx); x++) {
				int ch;
				ch = gdGetC (in);
				if (ch == EOF) {
					goto fail2;
				}
				/* ROW-MAJOR IN GD 1.3 */
				im->pixels[y][x] = ch;
			}
		}
	}
	return im;

fail2:
	gdImageDestroy (im);
fail1:
	return 0;
}